

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cc
# Opt level: O0

void __thiscall AVO::Agent::Agent(Agent *this)

{
  Vector2 *in_RDI;
  
  Vector2::Vector2(in_RDI);
  Vector2::Vector2(in_RDI + 1);
  Vector2::Vector2(in_RDI + 2);
  Vector2::Vector2(in_RDI + 3);
  in_RDI[4].x_ = 0.0;
  in_RDI[4].y_ = 0.0;
  in_RDI[5].x_ = 0.0;
  in_RDI[5].y_ = 0.0;
  in_RDI[6].x_ = 0.0;
  in_RDI[6].y_ = 0.0;
  in_RDI[7].x_ = 0.0;
  in_RDI[7].y_ = 0.0;
  in_RDI[8].x_ = 0.0;
  in_RDI[8].y_ = 0.0;
  std::deque<AVO::Vector2,_std::allocator<AVO::Vector2>_>::deque
            ((deque<AVO::Vector2,_std::allocator<AVO::Vector2>_> *)0x10584f);
  std::
  vector<std::pair<float,_const_AVO::Agent_*>,_std::allocator<std::pair<float,_const_AVO::Agent_*>_>_>
  ::vector((vector<std::pair<float,_const_AVO::Agent_*>,_std::allocator<std::pair<float,_const_AVO::Agent_*>_>_>
            *)0x105865);
  std::vector<AVO::Line,_std::allocator<AVO::Line>_>::vector
            ((vector<AVO::Line,_std::allocator<AVO::Line>_> *)0x105878);
  return;
}

Assistant:

Agent::Agent()
    : id_(0U),
      maxNeighbors_(0U),
      accelInterval_(0.0F),
      maxAccel_(0.0F),
      maxSpeed_(0.0F),
      neighborDist_(0.0F),
      radius_(0.0F),
      timeHorizon_(0.0F) {}